

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O1

bool __thiscall
CRollingBloomFilter::contains(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  long lVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = this->nHashFuncs < 1;
  if (0 < this->nHashFuncs) {
    iVar6 = 0;
    iVar7 = 0;
    do {
      uVar3 = MurmurHash3(this->nTweak + iVar6,vKey);
      puVar2 = (this->data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((ulong)((long)(this->data).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3 &
              0xffffffff) * (ulong)uVar3 >> 0x1d;
      if (((*(ulong *)((long)puVar2 + (uVar4 & 0xfffffffffffffff8 | 8)) |
           *(ulong *)((long)puVar2 + (uVar4 & 0xfffffffffffffff0))) >> ((ulong)uVar3 & 0x3f) & 1) ==
          0) break;
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + -0x45b386b;
      bVar5 = this->nHashFuncs <= iVar7;
    } while (iVar7 < this->nHashFuncs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CRollingBloomFilter::contains(Span<const unsigned char> vKey) const
{
    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        uint32_t pos = FastRange32(h, data.size());
        /* If the relevant bit is not set in either data[pos & ~1] or data[pos | 1], the filter does not contain vKey */
        if (!(((data[pos & ~1U] | data[pos | 1]) >> bit) & 1)) {
            return false;
        }
    }
    return true;
}